

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_endian.c
# Opt level: O0

unsigned_long_long Curl_read64_be(uchar *buf)

{
  uchar *buf_local;
  
  return (ulong)*buf << 0x38 | (ulong)buf[1] << 0x30 | (ulong)buf[2] << 0x28 | (ulong)buf[3] << 0x20
         | (ulong)buf[4] << 0x18 | (ulong)buf[5] << 0x10 | (ulong)buf[6] << 8 | (ulong)buf[7];
}

Assistant:

unsigned long long Curl_read64_be(unsigned char *buf)
{
  return ((unsigned long long)buf[0] << 56) |
         ((unsigned long long)buf[1] << 48) |
         ((unsigned long long)buf[2] << 40) |
         ((unsigned long long)buf[3] << 32) |
         ((unsigned long long)buf[4] << 24) |
         ((unsigned long long)buf[5] << 16) |
         ((unsigned long long)buf[6] << 8) |
         ((unsigned long long)buf[7]);
}